

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void DataTypeApplyOp(ImGuiDataType data_type,int op,void *value1,void *value2)

{
  float fVar1;
  
  if (data_type == ImGuiDataType_Float) {
    if (op == 0x2d) {
      fVar1 = *value1 - *value2;
    }
    else {
      if (op != 0x2b) {
        return;
      }
      fVar1 = *value1 + *value2;
    }
    *(float *)value1 = fVar1;
  }
  else if (data_type == ImGuiDataType_Int) {
    if (op == 0x2d) {
      *(int *)value1 = *value1 - *value2;
      return;
    }
    if (op == 0x2b) {
      *(int *)value1 = *value1 + *value2;
      return;
    }
  }
  return;
}

Assistant:

static void DataTypeApplyOp(ImGuiDataType data_type, int op, void* value1, const void* value2)// Store into value1
{
    if (data_type == ImGuiDataType_Int)
    {
        if (op == '+')
            *(int*)value1 = *(int*)value1 + *(const int*)value2;
        else if (op == '-')
            *(int*)value1 = *(int*)value1 - *(const int*)value2;
    }
    else if (data_type == ImGuiDataType_Float)
    {
        if (op == '+')
            *(float*)value1 = *(float*)value1 + *(const float*)value2;
        else if (op == '-')
            *(float*)value1 = *(float*)value1 - *(const float*)value2;
    }
}